

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  *(undefined4 *)&this_00[1]._vptr_Test = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__CodecTestWith3Params_010524a0;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }